

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizes
          (MessageGenerator *this,Printer *printer)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x68) == '\x01') {
    io::Printer::Print(printer,
                       "void $classname$::SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const {\n  _extensions_.SerializeMessageSetWithCachedSizes(output);\n"
                       ,"classname",&this->classname_);
    if (((this->options_).enforce_lite == true) ||
       (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 3)) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0xe4c);
      other = internal::LogMessage::operator<<
                        (&local_50,
                         "CHECK failed: UseUnknownFieldSet(descriptor_->file(), options_): ");
      internal::LogFinisher::operator=(&local_51,other);
      internal::LogMessage::~LogMessage(&local_50);
    }
    io::Printer::Print(printer,
                       "  ::google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItems(\n      unknown_fields(), output);\n"
                      );
    io::Printer::Print(printer,"}\n");
    return;
  }
  io::Printer::Print(printer,
                     "void $classname$::SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const {\n"
                     ,"classname",&this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"// @@protoc_insertion_point(serialize_start:$full_name$)\n",
                     "full_name",*(string **)(this->descriptor_ + 8));
  GenerateSerializeWithCachedSizesBody(this,printer,false);
  io::Printer::Print(printer,"// @@protoc_insertion_point(serialize_end:$full_name$)\n","full_name",
                     *(string **)(this->descriptor_ + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSerializeWithCachedSizes(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "void $classname$::SerializeWithCachedSizes(\n"
      "    ::google::protobuf::io::CodedOutputStream* output) const {\n"
      "  _extensions_.SerializeMessageSetWithCachedSizes(output);\n",
      "classname", classname_);
    GOOGLE_CHECK(UseUnknownFieldSet(descriptor_->file(), options_));
    printer->Print(
      "  ::google::protobuf::internal::WireFormat::SerializeUnknownMessageSetItems(\n"
      "      unknown_fields(), output);\n");
    printer->Print(
      "}\n");
    return;
  }

  printer->Print(
    "void $classname$::SerializeWithCachedSizes(\n"
    "    ::google::protobuf::io::CodedOutputStream* output) const {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "// @@protoc_insertion_point(serialize_start:$full_name$)\n",
    "full_name", descriptor_->full_name());

  GenerateSerializeWithCachedSizesBody(printer, false);

  printer->Print(
    "// @@protoc_insertion_point(serialize_end:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print(
    "}\n");
}